

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.hpp
# Opt level: O3

void __thiscall
hta::storage::file::File<hta::storage::file::Metric::Header,_hta::TimeAggregate>::check_size
          (File<hta::storage::file::Metric::Header,_hta::TimeAggregate> *this)

{
  long lVar1;
  path args_1;
  __mbstate_t _Var2;
  ulong uVar3;
  long args_3;
  undefined1 auVar4 [16];
  fpos<__mbstate_t> args_3_00;
  undefined1 in_stack_ffffffffffffff88 [24];
  fpos<__mbstate_t> in_stack_ffffffffffffffa0;
  path local_50;
  
  std::istream::seekg((long)&this->stream_,_S_beg);
  check_stream(this,"seekg to end for size");
  auVar4 = std::istream::tellg();
  _Var2 = auVar4._0_8_;
  lVar1 = (this->data_begin_)._M_off;
  args_3 = (long)_Var2 - lVar1;
  if ((long)_Var2 < lVar1) {
    Catch::clara::std::filesystem::__cxx11::path::path(&local_50,(path *)this);
    args_1._M_pathname.field_2 =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          )in_stack_ffffffffffffff88._0_16_;
    args_1._M_cmpts = (_List)in_stack_ffffffffffffff88[0x10];
    args_1._33_7_ = in_stack_ffffffffffffff88._17_7_;
    args_1._M_pathname._M_dataplus._M_p = (pointer)(this->data_begin_)._M_off;
    args_1._M_pathname._M_string_length._0_4_ = (this->data_begin_)._M_state.__count;
    args_1._M_pathname._M_string_length._4_4_ = (this->data_begin_)._M_state.__value;
    args_3_00._M_state = _Var2;
    args_3_00._M_off = (streamoff)", data_end: ";
    throw_exception<hta::Exception,char_const*,std::filesystem::__cxx11::path,char_const*,std::fpos<__mbstate_t>,char_const*,std::fpos<__mbstate_t>>
              ("File with negative data size: ",args_1,(char *)&local_50,args_3_00,auVar4._8_8_,
               in_stack_ffffffffffffffa0);
  }
  uVar3 = args_3 * 0x6db6db6db6db6db7;
  if ((uVar3 >> 3 | uVar3 << 0x3d) < 0x492492492492493) {
    return;
  }
  Catch::clara::std::filesystem::__cxx11::path::path((path *)&stack0xffffffffffffff88,(path *)this);
  throw_exception<hta::Exception,char_const*,std::filesystem::__cxx11::path,char_const*,long,char_const*,unsigned_long>
            ("File with irregular data size: ",(path *)&stack0xffffffffffffff88,", size in bytes: ",
             args_3,", value_size: ",0x38);
}

Assistant:

void check_size()
    {
        stream_.seekg(0, std::fstream::end);
        check_stream("seekg to end for size");
        auto data_end = stream_.tellg();
        if (data_end < data_begin_)
        {
            throw_exception("File with negative data size: ", filename_, ", data_end: ", data_end,
                            ", data_begin_: ", data_begin_);
        }
        auto size_bytes = data_end - data_begin_;
        if (size_bytes % value_size != 0)
        {
            throw_exception("File with irregular data size: ", filename_,
                            ", size in bytes: ", size_bytes, ", value_size: ", value_size);
        }
    }